

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseTypeCase::iterate(BaseTypeCase *this)

{
  undefined1 *puVar1;
  TestLog *pTVar2;
  RenderContext *renderCtx;
  bool bVar3;
  bool bVar4;
  ContextType CVar5;
  GLSLVersion version;
  int iVar6;
  deUint32 err;
  mapped_type *pmVar7;
  undefined4 extraout_var;
  ProgramSources *pPVar9;
  ostream *poVar10;
  NotSupportedError *this_00;
  long lVar11;
  long local_430;
  GLint type;
  allocator<char> local_41d;
  GLuint uniformIndex;
  vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  samplerTypes;
  undefined1 local_400 [8];
  int local_3f8;
  ScopedLogSection section;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  shaderArgs;
  int uniforms;
  undefined4 local_390 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string vertexSource;
  string fragmentSource;
  ShaderProgram program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  ResultCollector result;
  ostringstream buf;
  long lVar8;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&program);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&samplerTypes,this);
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar5,(ApiType)0x23);
  if (this->m_extension != (char *)0x0) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,this->m_extension);
    if (!bVar4 && !bVar3) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&program,this->m_extension,(allocator<char> *)&shaderArgs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                     "Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program);
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&buf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  local_430 = 0;
  lVar11 = 0;
  do {
    if ((int)(((long)samplerTypes.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)samplerTypes.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= lVar11) {
      tcu::ResultCollector::setTestContextResult
                (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
      ::~vector(&samplerTypes);
      tcu::ResultCollector::~ResultCollector(&result);
      return STOP;
    }
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_3f8 = *(int *)((long)&(samplerTypes.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->glType + local_430);
    local_400 = (undefined1  [8])glu::getShaderVarTypeName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&buf,local_400);
    local_390[0] = *(undefined4 *)
                    ((long)&(samplerTypes.
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->glType + local_430);
    _uniforms = glu::getShaderVarTypeName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&shaderArgs,&uniforms);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                   "Uniform type ",(string *)&shaderArgs);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&buf,(string *)&program);
    std::__cxx11::string::~string((string *)&program);
    std::__cxx11::string::~string((string *)&shaderArgs);
    std::__cxx11::string::~string((string *)&buf);
    shaderArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    shaderArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    shaderArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &shaderArgs._M_t._M_impl.super__Rb_tree_header._M_header;
    shaderArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    shaderArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         shaderArgs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"DECLARATIONSTR",(allocator<char> *)&program);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderArgs,(key_type *)&buf);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&buf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"ACCESSSTR",(allocator<char> *)&program);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderArgs,(key_type *)&buf);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&buf);
    bVar4 = this->m_extension != (char *)0x0;
    if (bVar4 && !bVar3) {
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      local_370._M_string_length = 0;
      local_370.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_240,&local_370,"#extension ");
      std::operator+(&local_220,&local_240,this->m_extension);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf,
                     &local_220," : require\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buf,glcts::fixed_sample_locations_values + 1,&local_41d);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,"EXTENSIONSTATEMENT",(allocator<char> *)local_400);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderArgs,(key_type *)&program);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&buf);
    std::__cxx11::string::~string((string *)&program);
    std::__cxx11::string::~string((string *)&buf);
    if (bVar4 && !bVar3) {
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_370);
    }
    CVar5.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    version = glu::getContextTypeGLSLVersion(CVar5);
    glu::getGLSLVersionDeclaration(version);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"VERSIONDECL",(allocator<char> *)&program);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&shaderArgs,(key_type *)&buf);
    std::__cxx11::string::assign((char *)pmVar7);
    std::__cxx11::string::~string((string *)&buf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,
               "${VERSIONDECL}\n${EXTENSIONSTATEMENT}${DECLARATIONSTR};\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nvoid main(void)\n{\n\tdEQP_FragColor = vec4(${ACCESSSTR});\n}\n"
               ,(allocator<char> *)local_400);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&buf,(string *)&program);
    tcu::StringTemplate::specialize(&fragmentSource,(StringTemplate *)&buf,&shaderArgs);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&buf);
    std::__cxx11::string::~string((string *)&program);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,
               "${VERSIONDECL}\nin highp vec4 a_position;\nvoid main(void)\n{\n\tgl_Position = a_position;\n}\n"
               ,(allocator<char> *)local_400);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&buf,(string *)&program);
    tcu::StringTemplate::specialize(&vertexSource,(StringTemplate *)&buf,&shaderArgs);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&buf);
    std::__cxx11::string::~string((string *)&program);
    iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar8 = CONCAT44(extraout_var,iVar6);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    memset((MessageBuilder *)&buf,0,0xac);
    buf.super_basic_ostream<char,_std::char_traits<char>_>._176_8_ = 0;
    buf.super_basic_ostream<char,_std::char_traits<char>_>._184_1_ = 0;
    buf.super_basic_ostream<char,_std::char_traits<char>_>._185_7_ = 0;
    buf.super_basic_ostream<char,_std::char_traits<char>_>._192_1_ = 0;
    buf.super_basic_ostream<char,_std::char_traits<char>_>._193_8_ = 0;
    glu::VertexSource::VertexSource((VertexSource *)local_400,&vertexSource);
    pPVar9 = glu::ProgramSources::operator<<((ProgramSources *)&buf,(ShaderSource *)local_400);
    glu::FragmentSource::FragmentSource((FragmentSource *)&uniforms,&fragmentSource);
    pPVar9 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)&uniforms);
    glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar9);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)&local_3f8);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&buf);
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Building program with uniform sampler of type ");
    local_3f8 = *(int *)((long)&(samplerTypes.
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->glType + local_430);
    local_400 = (undefined1  [8])glu::getShaderVarTypeName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_400,(ostream *)puVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    if (program.m_program.m_info.linkOk == false) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      &program);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buf,"could not build shader",(allocator<char> *)local_400);
      tcu::ResultCollector::fail(&result,(string *)&buf);
LAB_0127c405:
      std::__cxx11::string::~string((string *)&buf);
    }
    else {
      _uniforms = (code *)((ulong)_uniforms & 0xffffffff00000000);
      (**(code **)(lVar8 + 0x9d8))(program.m_program.m_program,0x8b86,&uniforms);
      if (uniforms != 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"Unexpected GL_ACTIVE_UNIFORMS, expected 1",
                   (allocator<char> *)local_400);
        tcu::ResultCollector::fail(&result,(string *)&buf);
        goto LAB_0127c405;
      }
      uniformIndex = 0;
      type = 0;
      buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Verifying uniform type.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
      (**(code **)(lVar8 + 0x770))(program.m_program.m_program,1,&uniformIndex,0x8a37,&type);
      if (type != *(int *)((long)&(samplerTypes.
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->glType + local_430))
      {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
        poVar10 = std::operator<<((ostream *)&buf,"Invalid type, expected ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,", got ");
        std::ostream::operator<<(poVar10,type);
        std::__cxx11::stringbuf::str();
        tcu::ResultCollector::fail(&result,(string *)local_400);
        std::__cxx11::string::~string((string *)local_400);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
      }
    }
    err = (**(code **)(lVar8 + 0x800))();
    glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderStateQueryTests.cpp"
                    ,0x9c);
    glu::ShaderProgram::~ShaderProgram(&program);
    std::__cxx11::string::~string((string *)&vertexSource);
    std::__cxx11::string::~string((string *)&fragmentSource);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&shaderArgs._M_t);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar11 = lVar11 + 1;
    local_430 = local_430 + 0x18;
  } while( true );
}

Assistant:

BaseTypeCase::IterateResult BaseTypeCase::iterate (void)
{
	static const char* const	vertexSourceTemplate	=	"${VERSIONDECL}\n"
															"in highp vec4 a_position;\n"
															"void main(void)\n"
															"{\n"
															"	gl_Position = a_position;\n"
															"}\n";
	static const char* const	fragmentSourceTemplate	=	"${VERSIONDECL}\n"
															"${EXTENSIONSTATEMENT}"
															"${DECLARATIONSTR};\n"
															"layout(location = 0) out highp vec4 dEQP_FragColor;\n"
															"void main(void)\n"
															"{\n"
															"	dEQP_FragColor = vec4(${ACCESSSTR});\n"
															"}\n";

	tcu::ResultCollector		result			(m_testCtx.getLog());
	std::vector<TestTypeInfo>	samplerTypes	= getInfos();
	const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (m_extension && !m_context.getContextInfo().isExtensionSupported(m_extension) && !supportsES32)
		throw tcu::NotSupportedError("Test requires " + std::string(m_extension));
	checkRequirements();

	for (int typeNdx = 0; typeNdx < (int)samplerTypes.size(); ++typeNdx)
	{
		const tcu::ScopedLogSection			section	(m_testCtx.getLog(),
													 std::string(glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType).toString()),
													 "Uniform type " + glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType).toString());

		std::map<std::string, std::string>	shaderArgs;
		shaderArgs["DECLARATIONSTR"]		= samplerTypes[typeNdx].declarationStr;
		shaderArgs["ACCESSSTR"]				= samplerTypes[typeNdx].accessStr;
		shaderArgs["EXTENSIONSTATEMENT"]	= (m_extension && !supportsES32) ? (std::string() + "#extension " + m_extension + " : require\n") : ("");
		shaderArgs["VERSIONDECL"]			= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));

		const std::string					fragmentSource	= tcu::StringTemplate(fragmentSourceTemplate).specialize(shaderArgs);
		const std::string					vertexSource	= tcu::StringTemplate(vertexSourceTemplate).specialize(shaderArgs);
		const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
		glu::ShaderProgram					program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << tcu::TestLog::Message << "Building program with uniform sampler of type " << glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType) << tcu::TestLog::EndMessage;

		if (!program.isOk())
		{
			m_testCtx.getLog() << program;
			result.fail("could not build shader");
		}
		else
		{
			// only one uniform -- uniform at index 0
			int uniforms = 0;
			gl.getProgramiv(program.getProgram(), GL_ACTIVE_UNIFORMS, &uniforms);

			if (uniforms != 1)
				result.fail("Unexpected GL_ACTIVE_UNIFORMS, expected 1");
			else
			{
				// check type
				const glw::GLuint	uniformIndex	= 0;
				glw::GLint			type			= 0;

				m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform type." << tcu::TestLog::EndMessage;
				gl.getActiveUniformsiv(program.getProgram(), 1, &uniformIndex, GL_UNIFORM_TYPE, &type);

				if (type != (glw::GLint)samplerTypes[typeNdx].glType)
				{
					std::ostringstream buf;
					buf << "Invalid type, expected " << samplerTypes[typeNdx].glType << ", got " << type;
					result.fail(buf.str());
				}
			}
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}